

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool is_char_name(int c)

{
  if ((((9 < c - 0x30U) && (0x19 < (c & 0xffffffdfU) - 0x41)) &&
      ((0x3e < c - 0x21U || ((0x40000000c40029bfU >> ((ulong)(c - 0x21U) & 0x3f) & 1) == 0)))) &&
     ((3 < c - 0x7bU || (c - 0x7bU == 1)))) {
    return false;
  }
  return true;
}

Assistant:

constexpr bool
is_char_name(const int c) noexcept
{
    if ((c >= static_cast<int>('a') && c <= static_cast<int>('z')) ||
        (c >= static_cast<int>('A') && c <= static_cast<int>('Z')) ||
        (c >= static_cast<int>('0') && c <= static_cast<int>('9')))
        return true;

    switch (c) {
    case '!':
    case '"':
    case '#':
    case '$':
    case '%':
    case '&':
    case '(':
    case ')':
    case ',':
    case '.':
    case ';':
    case '?':
    case '@':
    case '_':
    case '{':
    case '}':
    case '~':
        return true;
    default:
        return false;
    }
}